

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwWindowHint(int hint,int value)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int value_local;
  int hint_local;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    iVar1 = _glfw.hints.framebuffer.redBits;
    iVar2 = _glfw.hints.framebuffer.greenBits;
    iVar3 = _glfw.hints.framebuffer.blueBits;
    iVar4 = _glfw.hints.framebuffer.alphaBits;
    iVar5 = _glfw.hints.framebuffer.depthBits;
    iVar6 = _glfw.hints.framebuffer.stencilBits;
    iVar7 = _glfw.hints.framebuffer.accumRedBits;
    iVar8 = _glfw.hints.framebuffer.accumGreenBits;
    iVar9 = _glfw.hints.framebuffer.accumBlueBits;
    iVar10 = _glfw.hints.framebuffer.accumAlphaBits;
    iVar11 = _glfw.hints.framebuffer.auxBuffers;
    iVar12 = _glfw.hints.framebuffer.samples;
    iVar13 = _glfw.hints.context.client;
    iVar14 = _glfw.hints.context.source;
    iVar15 = _glfw.hints.context.major;
    iVar16 = _glfw.hints.context.minor;
    iVar17 = _glfw.hints.context.profile;
    iVar18 = _glfw.hints.context.robustness;
    iVar19 = _glfw.hints.context.release;
    iVar20 = _glfw.hints.refreshRate;
  }
  else {
    iVar1 = _glfw.hints.framebuffer.redBits;
    iVar2 = _glfw.hints.framebuffer.greenBits;
    iVar3 = _glfw.hints.framebuffer.blueBits;
    iVar4 = _glfw.hints.framebuffer.alphaBits;
    iVar5 = _glfw.hints.framebuffer.depthBits;
    iVar6 = _glfw.hints.framebuffer.stencilBits;
    iVar7 = _glfw.hints.framebuffer.accumRedBits;
    iVar8 = _glfw.hints.framebuffer.accumGreenBits;
    iVar9 = _glfw.hints.framebuffer.accumBlueBits;
    iVar10 = _glfw.hints.framebuffer.accumAlphaBits;
    iVar11 = _glfw.hints.framebuffer.auxBuffers;
    iVar12 = _glfw.hints.framebuffer.samples;
    iVar13 = _glfw.hints.context.client;
    iVar14 = _glfw.hints.context.source;
    iVar15 = _glfw.hints.context.major;
    iVar16 = _glfw.hints.context.minor;
    iVar17 = _glfw.hints.context.profile;
    iVar18 = _glfw.hints.context.robustness;
    iVar19 = _glfw.hints.context.release;
    iVar20 = _glfw.hints.refreshRate;
    if (hint == 0x20001) {
      _glfw.hints.window.focused = (GLFWbool)(value != 0);
    }
    else if (hint == 0x20003) {
      _glfw.hints.window.resizable = (GLFWbool)(value != 0);
    }
    else if (hint == 0x20004) {
      _glfw.hints.window.visible = (GLFWbool)(value != 0);
    }
    else if (hint == 0x20005) {
      _glfw.hints.window.decorated = (GLFWbool)(value != 0);
    }
    else if (hint == 0x20006) {
      _glfw.hints.window.autoIconify = (GLFWbool)(value != 0);
    }
    else if (hint == 0x20007) {
      _glfw.hints.window.floating = (GLFWbool)(value != 0);
    }
    else if (hint == 0x20008) {
      _glfw.hints.window.maximized = (GLFWbool)(value != 0);
    }
    else if (hint == 0x20009) {
      _glfw.hints.window.centerCursor = (GLFWbool)(value != 0);
    }
    else if (hint == 0x2000a) {
      _glfw.hints.framebuffer.transparent = (GLFWbool)(value != 0);
    }
    else if (hint == 0x2000c) {
      _glfw.hints.window.focusOnShow = (GLFWbool)(value != 0);
    }
    else {
      iVar1 = value;
      if ((((((hint != 0x21001) &&
             (iVar1 = _glfw.hints.framebuffer.redBits, iVar2 = value, hint != 0x21002)) &&
            (iVar2 = _glfw.hints.framebuffer.greenBits, iVar3 = value, hint != 0x21003)) &&
           (((iVar3 = _glfw.hints.framebuffer.blueBits, iVar4 = value, hint != 0x21004 &&
             (iVar4 = _glfw.hints.framebuffer.alphaBits, iVar5 = value, hint != 0x21005)) &&
            ((iVar5 = _glfw.hints.framebuffer.depthBits, iVar6 = value, hint != 0x21006 &&
             ((iVar6 = _glfw.hints.framebuffer.stencilBits, iVar7 = value, hint != 0x21007 &&
              (iVar7 = _glfw.hints.framebuffer.accumRedBits, iVar8 = value, hint != 0x21008))))))))
          && (iVar8 = _glfw.hints.framebuffer.accumGreenBits, iVar9 = value, hint != 0x21009)) &&
         ((iVar9 = _glfw.hints.framebuffer.accumBlueBits, iVar10 = value, hint != 0x2100a &&
          (iVar10 = _glfw.hints.framebuffer.accumAlphaBits, iVar11 = value, hint != 0x2100b)))) {
        if (hint == 0x2100c) {
          _glfw.hints.framebuffer.stereo = (GLFWbool)(value != 0);
          iVar11 = _glfw.hints.framebuffer.auxBuffers;
        }
        else {
          iVar11 = _glfw.hints.framebuffer.auxBuffers;
          iVar12 = value;
          if (hint != 0x2100d) {
            if (hint == 0x2100e) {
              _glfw.hints.framebuffer.sRGB = (GLFWbool)(value != 0);
              iVar12 = _glfw.hints.framebuffer.samples;
            }
            else {
              iVar12 = _glfw.hints.framebuffer.samples;
              iVar20 = value;
              if (hint != 0x2100f) {
                if (hint == 0x21010) {
                  _glfw.hints.framebuffer.doublebuffer = (GLFWbool)(value != 0);
                  iVar20 = _glfw.hints.refreshRate;
                }
                else {
                  iVar13 = value;
                  iVar20 = _glfw.hints.refreshRate;
                  if ((((hint != 0x22001) &&
                       (iVar13 = _glfw.hints.context.client, iVar15 = value, hint != 0x22002)) &&
                      (iVar15 = _glfw.hints.context.major, iVar16 = value, hint != 0x22003)) &&
                     (iVar16 = _glfw.hints.context.minor, iVar18 = value, hint != 0x22005)) {
                    if (hint == 0x22006) {
                      _glfw.hints.context.forward = (GLFWbool)(value != 0);
                      iVar18 = _glfw.hints.context.robustness;
                    }
                    else if (hint == 0x22007) {
                      _glfw.hints.context.debug = (GLFWbool)(value != 0);
                      iVar18 = _glfw.hints.context.robustness;
                    }
                    else {
                      iVar17 = value;
                      iVar18 = _glfw.hints.context.robustness;
                      if ((hint != 0x22008) &&
                         (iVar17 = _glfw.hints.context.profile, iVar19 = value, hint != 0x22009)) {
                        if (hint == 0x2200a) {
                          _glfw.hints.context.noerror = (GLFWbool)(value != 0);
                          iVar19 = _glfw.hints.context.release;
                        }
                        else {
                          iVar14 = value;
                          iVar19 = _glfw.hints.context.release;
                          if (hint != 0x2200b) {
                            if (hint == 0x23001) {
                              _glfw.hints.window.ns.retina = (GLFWbool)(value != 0);
                              iVar14 = _glfw.hints.context.source;
                            }
                            else if (hint == 0x23003) {
                              _glfw.hints.context.nsgl.offline = (GLFWbool)(value != 0);
                              iVar14 = _glfw.hints.context.source;
                            }
                            else {
                              _glfwInputError(0x10003,"Invalid window hint 0x%08X",(ulong)(uint)hint
                                             );
                              iVar1 = _glfw.hints.framebuffer.redBits;
                              iVar2 = _glfw.hints.framebuffer.greenBits;
                              iVar3 = _glfw.hints.framebuffer.blueBits;
                              iVar4 = _glfw.hints.framebuffer.alphaBits;
                              iVar5 = _glfw.hints.framebuffer.depthBits;
                              iVar6 = _glfw.hints.framebuffer.stencilBits;
                              iVar7 = _glfw.hints.framebuffer.accumRedBits;
                              iVar8 = _glfw.hints.framebuffer.accumGreenBits;
                              iVar9 = _glfw.hints.framebuffer.accumBlueBits;
                              iVar10 = _glfw.hints.framebuffer.accumAlphaBits;
                              iVar11 = _glfw.hints.framebuffer.auxBuffers;
                              iVar12 = _glfw.hints.framebuffer.samples;
                              iVar13 = _glfw.hints.context.client;
                              iVar14 = _glfw.hints.context.source;
                              iVar15 = _glfw.hints.context.major;
                              iVar16 = _glfw.hints.context.minor;
                              iVar17 = _glfw.hints.context.profile;
                              iVar18 = _glfw.hints.context.robustness;
                              iVar19 = _glfw.hints.context.release;
                              iVar20 = _glfw.hints.refreshRate;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  _glfw.hints.refreshRate = iVar20;
  _glfw.hints.context.release = iVar19;
  _glfw.hints.context.robustness = iVar18;
  _glfw.hints.context.profile = iVar17;
  _glfw.hints.context.minor = iVar16;
  _glfw.hints.context.major = iVar15;
  _glfw.hints.context.source = iVar14;
  _glfw.hints.context.client = iVar13;
  _glfw.hints.framebuffer.samples = iVar12;
  _glfw.hints.framebuffer.auxBuffers = iVar11;
  _glfw.hints.framebuffer.accumAlphaBits = iVar10;
  _glfw.hints.framebuffer.accumBlueBits = iVar9;
  _glfw.hints.framebuffer.accumGreenBits = iVar8;
  _glfw.hints.framebuffer.accumRedBits = iVar7;
  _glfw.hints.framebuffer.stencilBits = iVar6;
  _glfw.hints.framebuffer.depthBits = iVar5;
  _glfw.hints.framebuffer.alphaBits = iVar4;
  _glfw.hints.framebuffer.blueBits = iVar3;
  _glfw.hints.framebuffer.greenBits = iVar2;
  _glfw.hints.framebuffer.redBits = iVar1;
  return;
}

Assistant:

GLFWAPI void glfwWindowHint(int hint, int value)
{
    _GLFW_REQUIRE_INIT();

    switch (hint)
    {
        case GLFW_RED_BITS:
            _glfw.hints.framebuffer.redBits = value;
            return;
        case GLFW_GREEN_BITS:
            _glfw.hints.framebuffer.greenBits = value;
            return;
        case GLFW_BLUE_BITS:
            _glfw.hints.framebuffer.blueBits = value;
            return;
        case GLFW_ALPHA_BITS:
            _glfw.hints.framebuffer.alphaBits = value;
            return;
        case GLFW_DEPTH_BITS:
            _glfw.hints.framebuffer.depthBits = value;
            return;
        case GLFW_STENCIL_BITS:
            _glfw.hints.framebuffer.stencilBits = value;
            return;
        case GLFW_ACCUM_RED_BITS:
            _glfw.hints.framebuffer.accumRedBits = value;
            return;
        case GLFW_ACCUM_GREEN_BITS:
            _glfw.hints.framebuffer.accumGreenBits = value;
            return;
        case GLFW_ACCUM_BLUE_BITS:
            _glfw.hints.framebuffer.accumBlueBits = value;
            return;
        case GLFW_ACCUM_ALPHA_BITS:
            _glfw.hints.framebuffer.accumAlphaBits = value;
            return;
        case GLFW_AUX_BUFFERS:
            _glfw.hints.framebuffer.auxBuffers = value;
            return;
        case GLFW_STEREO:
            _glfw.hints.framebuffer.stereo = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        case GLFW_DOUBLEBUFFER:
            _glfw.hints.framebuffer.doublebuffer = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        case GLFW_TRANSPARENT_FRAMEBUFFER:
            _glfw.hints.framebuffer.transparent = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        case GLFW_SAMPLES:
            _glfw.hints.framebuffer.samples = value;
            return;
        case GLFW_SRGB_CAPABLE:
            _glfw.hints.framebuffer.sRGB = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        case GLFW_RESIZABLE:
            _glfw.hints.window.resizable = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        case GLFW_DECORATED:
            _glfw.hints.window.decorated = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        case GLFW_FOCUSED:
            _glfw.hints.window.focused = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        case GLFW_AUTO_ICONIFY:
            _glfw.hints.window.autoIconify = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        case GLFW_FLOATING:
            _glfw.hints.window.floating = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        case GLFW_MAXIMIZED:
            _glfw.hints.window.maximized = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        case GLFW_VISIBLE:
            _glfw.hints.window.visible = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        case GLFW_COCOA_RETINA_FRAMEBUFFER:
            _glfw.hints.window.ns.retina = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        case GLFW_COCOA_GRAPHICS_SWITCHING:
            _glfw.hints.context.nsgl.offline = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        case GLFW_CENTER_CURSOR:
            _glfw.hints.window.centerCursor = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        case GLFW_FOCUS_ON_SHOW:
            _glfw.hints.window.focusOnShow = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        case GLFW_CLIENT_API:
            _glfw.hints.context.client = value;
            return;
        case GLFW_CONTEXT_CREATION_API:
            _glfw.hints.context.source = value;
            return;
        case GLFW_CONTEXT_VERSION_MAJOR:
            _glfw.hints.context.major = value;
            return;
        case GLFW_CONTEXT_VERSION_MINOR:
            _glfw.hints.context.minor = value;
            return;
        case GLFW_CONTEXT_ROBUSTNESS:
            _glfw.hints.context.robustness = value;
            return;
        case GLFW_OPENGL_FORWARD_COMPAT:
            _glfw.hints.context.forward = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        case GLFW_OPENGL_DEBUG_CONTEXT:
            _glfw.hints.context.debug = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        case GLFW_CONTEXT_NO_ERROR:
            _glfw.hints.context.noerror = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        case GLFW_OPENGL_PROFILE:
            _glfw.hints.context.profile = value;
            return;
        case GLFW_CONTEXT_RELEASE_BEHAVIOR:
            _glfw.hints.context.release = value;
            return;
        case GLFW_REFRESH_RATE:
            _glfw.hints.refreshRate = value;
            return;
    }

    _glfwInputError(GLFW_INVALID_ENUM, "Invalid window hint 0x%08X", hint);
}